

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_realloc_array(JSContext *ctx,void **parray,int elem_size,int *psize,int req_size)

{
  int iVar1;
  size_t in_RAX;
  void *pvVar2;
  int iVar3;
  size_t slack;
  
  iVar1 = (*psize * 3) / 2;
  if (iVar1 < req_size) {
    iVar1 = req_size;
  }
  slack = in_RAX;
  pvVar2 = js_realloc2(ctx,*parray,(long)(iVar1 * elem_size),&slack);
  if (pvVar2 == (void *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = 0;
    *psize = iVar1 + (int)(slack / (uint)elem_size);
    *parray = pvVar2;
  }
  return iVar3;
}

Assistant:

static no_inline int js_realloc_array(JSContext *ctx, void **parray,
                                      int elem_size, int *psize, int req_size)
{
    int new_size;
    size_t slack;
    void *new_array;
    /* XXX: potential arithmetic overflow */
    new_size = max_int(req_size, *psize * 3 / 2);
    new_array = js_realloc2(ctx, *parray, new_size * elem_size, &slack);
    if (!new_array)
        return -1;
    new_size += slack / elem_size;
    *psize = new_size;
    *parray = new_array;
    return 0;
}